

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O3

void __thiscall
wasm::ParamUtils::localizeCallsTo::LocalizerPass::~LocalizerPass(LocalizerPass *this)

{
  PassRunner *pPVar1;
  pointer pTVar2;
  
  (this->super_WalkerPass<wasm::PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>_>).
  super_Pass._vptr_Pass = (_func_int **)&PTR__LocalizerPass_01071420;
  pPVar1 = this[1].
           super_WalkerPass<wasm::PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>_>.
           super_Pass.runner;
  if (pPVar1 != (PassRunner *)0x0) {
    (*(code *)pPVar1)(&this->optimized,&this->optimized,3);
  }
  pTVar2 = (this->
           super_WalkerPass<wasm::PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>_>).
           super_PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>.
           super_Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::Task,_std::allocator<wasm::Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>_>
                                          ).
                                          super_PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>
                                          .
                                          super_Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::Task,_std::allocator<wasm::Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar2);
  }
  Pass::~Pass((Pass *)this);
  operator_delete(this,0x160);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }